

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpAcceptor::handle_accept
          (TcpAcceptor *this,pointer *ptr,pointer *new_connection,error_code *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  element_type *peVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  int iVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  error_code ec;
  string local_b8;
  shared_ptr<gmlc::networking::TcpConnection> local_98;
  shared_ptr<gmlc::networking::TcpAcceptor> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  shared_ptr<gmlc::networking::TcpAcceptor> local_38;
  
  if ((this->state)._M_i == CONNECTED) {
    if (error->_M_value == 0) {
      if ((this->acceptCall).super__Function_base._M_manager == (_Manager_type)0x0) {
        peVar4 = (new_connection->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        peVar5 = (peVar4->socket_).
                 super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var9 = (peVar4->socket_).
                 super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
        iVar7 = 1;
        (*peVar5->_vptr_Socket[0xe])(peVar5,1,0);
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        TcpConnection::close
                  ((new_connection->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,iVar7);
        concurrency::TriggerVariable::reset(&this->accepting);
        return;
      }
      concurrency::TriggerVariable::reset(&this->accepting);
      local_88.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
      local_88.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      local_98.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (new_connection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_98.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      (new_connection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (new_connection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      if ((this->acceptCall).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->acceptCall)._M_invoker)((_Any_data *)&this->acceptCall,&local_88,&local_98);
        if (local_98.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.
                     super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_88.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.
                     super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (((this->accepting).activated._M_base._M_i & 1U) != 0) {
          return;
        }
        concurrency::TriggerVariable::trigger(&this->accepting);
        return;
      }
      std::__throw_bad_function_call();
    }
    iVar7 = 0x7d;
    std::error_code::error_code<asio::error::basic_errors,void>
              ((error_code *)&local_b8,operation_aborted);
    if ((error->_M_cat == (error_category *)local_b8._M_string_length) &&
       (error->_M_value == (int)local_b8._M_dataplus._M_p)) goto LAB_00431f33;
    if ((this->errorCall).super__Function_base._M_manager == (_Manager_type)0x0) {
      paVar2 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58," error in accept::","");
      (**(code **)(*(long *)error->_M_cat + 0x20))(&local_78,error->_M_cat,error->_M_value);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        uVar8 = local_58.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_78._M_string_length + local_58._M_string_length) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          uVar8 = local_78.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_78._M_string_length + local_58._M_string_length) goto LAB_00431ded;
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_78,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
      }
      else {
LAB_00431ded:
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar6->_M_dataplus)._M_p;
      paVar1 = &pbVar6->field_2;
      if (paVar3 == paVar1) {
        local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_b8._M_dataplus._M_p = (pointer)paVar3;
      }
      local_b8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar6->_M_string_length = 0;
      paVar1->_M_local_buf[0] = '\0';
      logger(this,0,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_38.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
      local_38.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (*(this->errorCall)._M_invoker)((_Any_data *)&this->errorCall,&local_38,error);
      if (local_38.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.
                   super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    peVar4 = (new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar5 = (peVar4->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var9 = (peVar4->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    iVar7 = 1;
    (*peVar5->_vptr_Socket[0xe])(peVar5,1,0);
  }
  else {
    local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
    local_b8._M_string_length = std::_V2::system_category();
    peVar4 = (new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar5 = (peVar4->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var9 = (peVar4->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    iVar7 = 1;
    (*peVar5->_vptr_Socket[0xf])(peVar5,1,0,&local_b8);
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
LAB_00431f33:
  TcpConnection::close
            ((new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ,iVar7);
  concurrency::TriggerVariable::reset(&this->accepting);
  return;
}

Assistant:

void TcpAcceptor::handle_accept(
    TcpAcceptor::pointer ptr,
    TcpConnection::pointer new_connection,
    const std::error_code& error)
{
    if (state.load() != AcceptingStates::CONNECTED) {
        std::error_code ec;
        new_connection->socket()->set_option_linger(true, 0, ec);
        new_connection->close();
        accepting.reset();
        return;
    }
    if (!error) {
        if (acceptCall) {
            accepting.reset();
            acceptCall(std::move(ptr), std::move(new_connection));
            if (!accepting.isActive()) {
                accepting.trigger();
            }
        } else {
            try {
                new_connection->socket()->set_option_linger(true, 0);
            }
            catch (...) {
            }
            new_connection->close();
            accepting.reset();
        }
    } else if (error != asio::error::operation_aborted) {
        if (errorCall) {
            errorCall(std::move(ptr), error);
        } else {
            logger(0, std::string(" error in accept::") + error.message());
        }
        try {
            new_connection->socket()->set_option_linger(true, 0);
        }
        catch (...) {
        }
        new_connection->close();
        accepting.reset();
    } else {
        new_connection->close();
        accepting.reset();
    }
}